

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::Function::WhileEachInst
          (Function *this,function<bool_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts,bool run_on_non_semantic_insts)

{
  bool bVar1;
  Instruction *pIVar2;
  reference this_00;
  pointer this_01;
  reference puVar3;
  pointer pIVar4;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *non_semantic;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *__range3;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *bb;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *__range2_1;
  Instruction *next_instruction;
  Instruction *di;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *param;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *__range2;
  bool run_on_non_semantic_insts_local;
  bool run_on_debug_line_insts_local;
  function<bool_(spvtools::opt::Instruction_*)> *f_local;
  Function *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    pIVar4 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(&this->def_inst_);
    bVar1 = Instruction::WhileEachInst(pIVar4,f,run_on_debug_line_insts);
    if (!bVar1) {
      return false;
    }
  }
  __end2 = std::
           vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           ::begin(&this->params_);
  param = (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           *)std::
             vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ::end(&this->params_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>_>
                                     *)&param), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>_>
             ::operator*(&__end2);
    pIVar4 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(puVar3);
    bVar1 = Instruction::WhileEachInst(pIVar4,f,run_on_debug_line_insts);
    if (!bVar1) {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>_>
    ::operator++(&__end2);
  }
  bVar1 = utils::IntrusiveList<spvtools::opt::Instruction>::empty
                    (&(this->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>
                    );
  if (bVar1) {
LAB_00391c11:
    __end2_1 = std::
               vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ::begin(&this->blocks_);
    bb = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
         std::
         vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ::end(&this->blocks_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                               *)&bb), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                ::operator*(&__end2_1);
      this_01 = std::
                unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ::operator->(this_00);
      bVar1 = BasicBlock::WhileEachInst(this_01,f,run_on_debug_line_insts);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
      ::operator++(&__end2_1);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->end_inst_);
    if (bVar1) {
      pIVar4 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(&this->end_inst_);
      bVar1 = Instruction::WhileEachInst(pIVar4,f,run_on_debug_line_insts);
      if (!bVar1) {
        return false;
      }
    }
    if (run_on_non_semantic_insts) {
      __end3 = std::
               vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               ::begin(&this->non_semantic_);
      non_semantic = (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)std::
                        vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                        ::end(&this->non_semantic_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>_>
                                         *)&non_semantic), bVar1) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>_>
                 ::operator*(&__end3);
        pIVar4 = std::
                 unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ::operator->(puVar3);
        bVar1 = Instruction::WhileEachInst(pIVar4,f,run_on_debug_line_insts);
        if (!bVar1) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    next_instruction =
         utils::IntrusiveList<spvtools::opt::Instruction>::front
                   (&(this->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>)
    ;
    do {
      if (next_instruction == (Instruction *)0x0) goto LAB_00391c11;
      pIVar2 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                         (&next_instruction->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      bVar1 = Instruction::WhileEachInst(next_instruction,f,run_on_debug_line_insts);
      next_instruction = pIVar2;
    } while (bVar1);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Function::WhileEachInst(const std::function<bool(Instruction*)>& f,
                             bool run_on_debug_line_insts,
                             bool run_on_non_semantic_insts) {
  if (def_inst_) {
    if (!def_inst_->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (auto& param : params_) {
    if (!param->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (!debug_insts_in_header_.empty()) {
    Instruction* di = &debug_insts_in_header_.front();
    while (di != nullptr) {
      Instruction* next_instruction = di->NextNode();
      if (!di->WhileEachInst(f, run_on_debug_line_insts)) return false;
      di = next_instruction;
    }
  }

  for (auto& bb : blocks_) {
    if (!bb->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (end_inst_) {
    if (!end_inst_->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (run_on_non_semantic_insts) {
    for (auto& non_semantic : non_semantic_) {
      if (!non_semantic->WhileEachInst(f, run_on_debug_line_insts)) {
        return false;
      }
    }
  }

  return true;
}